

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

PlotData * __thiscall gnuplotio::PlotData::file(PlotData *this,string *fn)

{
  fstream fh;
  undefined1 auStack_218 [16];
  ostream local_208;
  
  std::__cxx11::string::_M_assign((string *)&this->filename);
  this->is_inline = false;
  std::fstream::fstream
            (auStack_218,(this->filename)._M_dataplus._M_p,(this->is_text ^ 1) * 4 + _S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_208,(this->data)._M_dataplus._M_p,(this->data)._M_string_length);
  std::fstream::close();
  std::fstream::~fstream(auStack_218);
  return this;
}

Assistant:

PlotData &file(const std::string &fn) {
        filename = fn;
        is_inline = false;

        std::ios_base::openmode mode = std::fstream::out;
        if(!is_text) mode |= std::fstream::binary;
        std::fstream fh(filename.c_str(), mode);
        fh << data;
        fh.close();

        return *this;
    }